

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O0

uint8_t * MuxEmitRiffHeader(uint8_t *data,size_t size)

{
  uint8_t *in_RSI;
  long in_RDI;
  uint32_t in_stack_ffffffffffffffec;
  
  PutLE32(in_RSI,in_stack_ffffffffffffffec);
  PutLE32(in_RSI,in_stack_ffffffffffffffec);
  PutLE32(in_RSI,in_stack_ffffffffffffffec);
  return (uint8_t *)(in_RDI + 0xc);
}

Assistant:

uint8_t* MuxEmitRiffHeader(uint8_t* const data, size_t size) {
  PutLE32(data + 0, MKFOURCC('R', 'I', 'F', 'F'));
  PutLE32(data + TAG_SIZE, (uint32_t)size - CHUNK_HEADER_SIZE);
  assert(size == (uint32_t)size);
  PutLE32(data + TAG_SIZE + CHUNK_SIZE_BYTES, MKFOURCC('W', 'E', 'B', 'P'));
  return data + RIFF_HEADER_SIZE;
}